

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_TryMove(AActor *thing,DVector2 *pos,int dropoff,secplane_t *onfloor,FCheckPosition *tm,
              bool missileCheck)

{
  double *pdVar1;
  byte *pbVar2;
  double dVar3;
  int iVar4;
  line_t *plVar5;
  player_t *ppVar6;
  sector_t *psVar7;
  sector_t *psVar8;
  line_t_conflict *line;
  sector_t_conflict *psVar9;
  bool bVar10;
  spechit_t *psVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  uint uVar15;
  uint uVar16;
  DBot *pDVar17;
  undefined8 extraout_RAX;
  AActor *pAVar18;
  subsector_t *psVar19;
  char cVar20;
  int iVar21;
  ulong uVar22;
  ASectorAction *pAVar23;
  line_t *ld;
  DVector2 *posforwindowcheck;
  long lVar24;
  long lVar25;
  Angle *pAVar26;
  FLinePortal *pFVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  divline_t dl2;
  divline_t dl1;
  FLinkContext ctx_1;
  line_t_conflict *local_110;
  divline_t local_108;
  double local_e0;
  DVector2 *local_d8;
  ulong local_d0;
  double local_c8;
  double local_c0;
  sector_t *local_b8;
  Angle *local_b0;
  AActor *local_a8;
  divline_t local_a0;
  Angle *local_80;
  double *local_78;
  DVector3 *local_70;
  double local_68;
  double local_60;
  double local_58;
  FName local_4c;
  DVector2 local_48;
  DAngle local_38;
  
  local_b8 = thing->Sector;
  tm->floatok = false;
  tm->portalstep = false;
  dVar30 = (thing->__Pos).Z;
  if (onfloor != (secplane_t *)0x0) {
    (thing->__Pos).Z =
         ((onfloor->normal).Y * pos->Y + (onfloor->normal).X * pos->X + onfloor->D) * onfloor->negiC
    ;
  }
  pbVar2 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar2 = *pbVar2 | 0x10;
  local_d8 = pos;
  bVar12 = P_CheckPosition(thing,pos,tm,false);
  if (!bVar12) {
    pAVar18 = thing->BlockingMobj;
    iVar21 = 2;
    if ((((pAVar18 != (AActor *)0x0) && (pAVar18->player == (player_t *)0x0)) &&
        (thing->player != (player_t *)0x0)) &&
       (dVar31 = (pAVar18->__Pos).Z + pAVar18->Height, dVar32 = dVar31 - (thing->__Pos).Z,
       dVar32 < thing->MaxStepHeight || dVar32 == thing->MaxStepHeight)) {
      psVar7 = pAVar18->Sector;
      if (((thing->Height <=
            ((psVar7->ceilingplane).normal.Y * local_d8->Y +
            (psVar7->ceilingplane).normal.X * local_d8->X + (psVar7->ceilingplane).D) *
            (psVar7->ceilingplane).negiC - dVar31) || ((psVar7->planes[1].Flags & 0x1d0U) == 0x100))
         && ((thing->Height <= tm->ceilingz - dVar31 &&
             ((((tm->thing->flags2).Value & 0x1000) == 0 ||
              (iVar21 = 0, (i_compatflags & 0x10U) != 0)))))) {
        (thing->__Pos).Z = dVar30;
        pbVar2 = (byte *)((long)&(thing->flags6).Value + 3);
        *pbVar2 = *pbVar2 & 0xef;
        iVar21 = 1;
      }
    }
    if (iVar21 == 2) goto LAB_0040ca8d;
    if (iVar21 != 0) {
      return false;
    }
  }
  uVar15 = (thing->flags3).Value;
  if ((uVar15 & 1) == 0) {
    if ((uVar15 & 2) != 0) {
      dVar31 = tm->ceilingz - thing->Height;
      goto LAB_0040ca29;
    }
  }
  else {
    dVar31 = tm->floorz;
LAB_0040ca29:
    (thing->__Pos).Z = dVar31;
  }
  if ((onfloor != (secplane_t *)0x0) && (tm->floorsector == thing->floorsector)) {
    (thing->__Pos).Z = tm->floorz;
  }
  uVar16 = (thing->flags).Value;
  if ((uVar16 >> 0xc & 1) != 0) goto LAB_0040cff1;
  dVar31 = tm->floorz;
  dVar32 = tm->ceilingz;
  dVar33 = thing->Height;
  if (dVar32 - dVar31 < dVar33) {
LAB_0040ca8d:
    pbVar2 = (byte *)((long)&(thing->flags6).Value + 3);
    *pbVar2 = *pbVar2 & 0xef;
    if (((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) &&
       ((thing->__Pos).Z = dVar30, ((thing->flags).Value & 0x9000) == 0)) {
      pAVar18 = tm->thing;
      if (((pAVar18->flags2).Value & 8) != 0) {
        local_4c.Index = 0x89;
        local_38.Degrees = 0.0;
        P_DamageMobj(pAVar18,(AActor *)0x0,(AActor *)0x0,pAVar18->Mass >> 5,&local_4c,0,&local_38);
      }
      lVar24 = (long)(int)spechit.Count;
      if (0 < lVar24) {
        lVar25 = lVar24 + 1;
        lVar24 = lVar24 * 0x28 + -0x10;
        do {
          psVar11 = spechit.Array;
          plVar5 = *(line_t **)((long)spechit.Array + lVar24 + -0x18);
          dVar30 = *(double *)((long)&(spechit.Array)->line + lVar24);
          dVar31 = *(double *)((long)&((spechit.Array)->Oldrefpos).X + lVar24);
          if (((byte)i_compatflags2 & 8) == 0) {
            uVar15 = (uint)(1.52587890625e-05 <
                           ((plVar5->v1->p).X - dVar30) * (plVar5->delta).Y +
                           (dVar31 - (plVar5->v1->p).Y) * (plVar5->delta).X);
          }
          else {
            uVar15 = P_VanillaPointOnLineSide(dVar30,dVar31,plVar5);
          }
          posforwindowcheck = (DVector2 *)((long)&psVar11->line + lVar24);
          CheckForPushSpecial((line_t *)posforwindowcheck[-2].Y,uVar15,thing,posforwindowcheck);
          lVar25 = lVar25 + -1;
          lVar24 = lVar24 + -0x28;
        } while (1 < lVar25);
      }
    }
    return false;
  }
  tm->floatok = true;
  if ((((((uVar16 & 0x8000) == 0) && ((uVar15 & 2) == 0)) && (dVar32 < (thing->__Pos).Z + dVar33))
      && (((uVar16 >> 9 & 1) == 0 || (((thing->flags2).Value & 0x10) == 0)))) ||
     (((uVar16 >> 9 & 1) != 0 &&
      ((((thing->flags2).Value & 0x10) != 0 && (dVar32 < dVar33 + (thing->__Pos).Z))))))
  goto LAB_0040ca8d;
  if ((uVar15 & 1) == 0 && (uVar16 & 0x8000) == 0) {
    if (((((uVar16 >> 0x10 & 1) != 0) && (((thing->flags6).Value & 0x80) == 0)) &&
        (pdVar1 = &(thing->__Pos).Z, *pdVar1 <= dVar31 && dVar31 != *pdVar1)) ||
       (dVar32 = (thing->__Pos).Z,
       thing->MaxStepHeight <= dVar31 - dVar32 && dVar31 - dVar32 != thing->MaxStepHeight))
    goto LAB_0040ca8d;
    if (dVar32 < dVar31) {
      (thing->__Pos).Z = dVar31;
      bVar12 = P_TestMobjZ(thing,true,(AActor **)0x0);
      (thing->__Pos).Z = dVar32;
      if (!bVar12) goto LAB_0040ca8d;
      if ((((thing->flags6).Value & 0x80) != 0) &&
         ((thing->__Pos).Z = tm->floorz, pdVar1 = &(thing->Vel).Z, *pdVar1 <= 0.0 && *pdVar1 != 0.0)
         ) {
        if (((thing->BounceFlags).Value & 2) == 0) {
          (thing->Vel).Z = 0.0;
        }
        else {
          AActor::FloorBounceMissile(thing,&tm->floorsector->floorplane);
        }
      }
      if (!bVar12) goto LAB_0040ca8d;
    }
  }
  if ((i_compatflags & 0x100000U) != 0) {
    dropoff = dropoff & (int)((thing->flags4).Value << 0xc) >> 0x1f;
  }
  if (dropoff == 2) {
    if ((tm->floorz - tm->dropoffz <= 128.0) &&
       (pAVar18 = (thing->target).field_0.p, pAVar18 != (AActor *)0x0)) {
      if (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        dropoff = 2;
        if ((((thing->target).field_0.p)->__Pos).Z <= tm->dropoffz) goto LAB_0040ce4b;
      }
      else {
        (thing->target).field_0.p = (AActor *)0x0;
      }
    }
    dropoff = 0;
  }
LAB_0040ce4b:
  if (((dropoff == 0) && (((thing->flags).Value & 0x14400) == 0)) ||
     (((thing->flags5).Value & 4) != 0)) {
    if (((thing->flags5).Value & 0x20) == 0) {
      dVar31 = tm->floorz;
      uVar28 = SUB84(dVar31,0);
      uVar29 = (undefined4)((ulong)dVar31 >> 0x20);
      uVar15 = (thing->flags2).Value;
      if ((uVar15 >> 0xb & 1) != 0) {
        dVar32 = (thing->__Pos).Z;
        if (dVar32 <= dVar31) {
          dVar32 = dVar31;
        }
        uVar28 = SUB84(dVar32,0);
        uVar29 = (undefined4)((ulong)dVar32 >> 0x20);
      }
      dVar31 = (double)CONCAT44(uVar29,uVar28) - tm->dropoffz;
      if ((dVar31 < thing->MaxDropOffHeight || dVar31 == thing->MaxDropOffHeight) ||
         ((char)((uVar15 & 8) >> 3) != '\0' || missileCheck)) goto LAB_0040cee3;
      goto LAB_0040cfd6;
    }
    if ((thing->floorz - tm->floorz <= thing->MaxDropOffHeight) &&
       (thing->dropoffz - tm->dropoffz <= thing->MaxDropOffHeight)) goto LAB_0040cee3;
  }
  else {
LAB_0040cee3:
    if ((((thing->flags2).Value & 0x2000000) == 0) ||
       ((((tm->floorpic).texnum == (thing->floorpic).texnum &&
         (dVar31 = tm->floorz - (thing->__Pos).Z, dVar31 == 0.0)) && (!NAN(dVar31))))) {
      ppVar6 = thing->player;
      if ((ppVar6 != (player_t *)0x0) && (pDVar17 = (ppVar6->Bot).field_0.p, pDVar17 != (DBot *)0x0)
         ) {
        if (((pDVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((((thing->flags).Value & 4) != 0) && (tm->sector != thing->Sector)) &&
             (bVar12 = FCajunMaster::IsDangerous(&bglobal,tm->sector), bVar12)) {
            pDVar17 = (thing->player->Bot).field_0.p;
            if ((pDVar17 != (DBot *)0x0) &&
               (((pDVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (thing->player->Bot).field_0.p = (DBot *)0x0;
              pDVar17 = (DBot *)0x0;
            }
            (((thing->player->Bot).field_0.p)->prev).field_0 = (pDVar17->dest).field_0;
            (((thing->player->Bot).field_0.p)->dest).field_0.p = (AActor *)0x0;
            (thing->Vel).X = 0.0;
            (thing->Vel).Y = 0.0;
            goto LAB_0040cfd6;
          }
        }
        else {
          (ppVar6->Bot).field_0.p = (DBot *)0x0;
        }
      }
LAB_0040cff1:
      if (thing->player == (player_t *)0x0) {
        dVar31 = thing->Height * 0.5;
      }
      else {
        dVar31 = thing->player->viewheight;
      }
      psVar7 = local_b8->heightsec;
      if (psVar7 == (sector_t *)0x0) {
        bVar10 = true;
        bVar12 = true;
      }
      else {
        dVar32 = (thing->__Pos).X;
        dVar33 = (thing->__Pos).Y;
        bVar12 = dVar30 + dVar31 <=
                 ((psVar7->floorplane).normal.Y * dVar33 +
                 (psVar7->floorplane).normal.X * dVar32 + (psVar7->floorplane).D) *
                 (psVar7->floorplane).negiC;
        bVar10 = dVar30 + dVar31 <=
                 (dVar33 * (psVar7->ceilingplane).normal.Y +
                 dVar32 * (psVar7->ceilingplane).normal.X + (psVar7->ceilingplane).D) *
                 (psVar7->ceilingplane).negiC;
      }
      if (((((thing->BounceFlags).Value & 0x1000) != 0) && (((thing->flags).Value & 0x10200) == 0))
         && ((bVar13 = AActor::IsSentient(thing), !bVar13 && (16.0 < tm->floorz - (thing->__Pos).Z))
            )) goto LAB_0040d0e6;
      local_70 = &thing->Vel;
      local_78 = &(thing->Vel).Y;
      local_b0 = &(thing->Angles).Yaw;
      local_d0 = 0;
      local_110 = (line_t_conflict *)onfloor;
      local_a8 = thing;
      local_80 = local_b0;
      do {
        pAVar26 = local_b0;
        if (portalhit.Count == 0) {
          dVar30 = 1.1;
        }
        else {
          lVar24 = 0x20;
          uVar22 = 0;
          dVar30 = 1.1;
          do {
            psVar11 = portalhit.Array;
            plVar5 = *(line_t **)((long)portalhit.Array + lVar24 + -0x20);
            if (plVar5->frontsector->PortalGroup == thing->Sector->PortalGroup) {
              dVar32 = *(double *)((long)portalhit.Array + lVar24 + -0x18);
              dVar33 = *(double *)((long)portalhit.Array + lVar24 + -0x10);
              if (((byte)i_compatflags2 & 8) == 0) {
                uVar15 = (uint)(1.52587890625e-05 <
                               ((plVar5->v1->p).X - dVar32) * (plVar5->delta).Y +
                               (dVar33 - (plVar5->v1->p).Y) * (plVar5->delta).X);
              }
              else {
                uVar15 = P_VanillaPointOnLineSide(dVar32,dVar33,plVar5);
              }
              dVar32 = *(double *)((long)psVar11 + lVar24 + -8);
              dVar33 = *(double *)((long)&psVar11->line + lVar24);
              if (((byte)i_compatflags2 & 8) == 0) {
                bVar13 = 1.52587890625e-05 <
                         ((plVar5->v1->p).X - dVar32) * (plVar5->delta).Y +
                         (dVar33 - (plVar5->v1->p).Y) * (plVar5->delta).X;
              }
              else {
                iVar21 = P_VanillaPointOnLineSide(dVar32,dVar33,plVar5);
                bVar13 = iVar21 == 1;
              }
              thing = local_a8;
              if ((uVar15 == 0) && (bVar13)) {
                local_108.x = (plVar5->v1->p).X;
                local_108.y = (plVar5->v1->p).Y;
                local_108.dx = (plVar5->delta).X;
                local_108.dy = (plVar5->delta).Y;
                local_a0.x = *(double *)((long)psVar11 + lVar24 + -0x18);
                local_a0.y = *(double *)((long)psVar11 + lVar24 + -0x10);
                local_a0.dx = *(double *)((long)psVar11 + lVar24 + -8) - local_a0.x;
                local_a0.dy = *(double *)((long)&psVar11->line + lVar24) - local_a0.y;
                dVar32 = P_InterceptVector(&local_a0,&local_108);
                thing = local_a8;
                if (dVar32 < dVar30) {
                  local_110 = *(line_t_conflict **)((long)psVar11 + lVar24 + -0x20);
                  local_c8 = *(double *)((long)psVar11 + lVar24 + -0x10);
                  local_e0 = *(double *)((long)psVar11 + lVar24 + -0x18);
                  local_60 = *(double *)((long)&psVar11->line + lVar24);
                  local_58 = *(double *)((long)psVar11 + lVar24 + -8);
                  pAVar26 = (Angle *)(uVar22 & 0xffffffff);
                  dVar30 = dVar32;
                }
              }
            }
            uVar22 = uVar22 + 1;
            lVar24 = lVar24 + 0x28;
          } while (uVar22 < portalhit.Count);
        }
        cVar20 = '\x04';
        local_b0 = pAVar26;
        if (dVar30 < 1.1) {
          uVar15 = (uint)pAVar26;
          if (uVar15 < portalhit.Count) {
            portalhit.Count = portalhit.Count - 1;
            if (uVar15 <= portalhit.Count && portalhit.Count - uVar15 != 0) {
              memmove(portalhit.Array + ((ulong)pAVar26 & 0xffffffff),portalhit.Array + (uVar15 + 1)
                      ,(ulong)(portalhit.Count - uVar15) * 0x28);
            }
          }
          pFVar27 = linePortals.Array + local_110->portalindex;
          if (linePortals.Count <= local_110->portalindex) {
            pFVar27 = (FLinePortal *)0x0;
          }
          if (pFVar27->mType == '\x03') {
            local_108.x = 0.0;
            local_108.y = 0.0;
            AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_108);
            dVar32 = (pFVar27->mDisplacement).X;
            dVar33 = (pFVar27->mDisplacement).Y;
            dVar3 = (tm->pos).Y;
            (thing->__Pos).X = (tm->pos).X + dVar32;
            (thing->__Pos).Y = dVar3 + dVar33;
            (thing->Prev).X = dVar32 + (thing->Prev).X;
            (thing->Prev).Y = dVar33 + (thing->Prev).Y;
            AActor::LinkToWorld(thing,(FLinkContext *)&local_108,false,(sector_t *)0x0);
            P_FindFloorCeiling(thing,0);
            tm->portalstep = false;
            local_d0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else if ((local_d0 & 1) == 0) {
            local_108.x = (tm->pos).X;
            local_108.y = (tm->pos).Y;
            dVar32 = (thing->__Pos).Z;
            local_c0 = (thing->__Pos).X;
            local_a0.y = (thing->__Pos).Y;
            local_108.dx = dVar32;
            local_a0.x = local_c0;
            local_68 = local_a0.y;
            P_TranslatePortalXY(local_110,&local_108.x,&local_108.y);
            P_TranslatePortalXY(local_110,&local_a0.x,&local_a0.y);
            P_TranslatePortalZ(local_110,&local_108.dx);
            (thing->__Pos).Z = local_108.dx;
            (thing->__Pos).X = local_a0.x;
            (thing->__Pos).Y = local_a0.y;
            local_48.X = local_108.x;
            local_48.Y = local_108.y;
            cVar14 = P_CheckPosition(thing,&local_48,true);
            if ((bool)cVar14) {
              local_c0 = (double)CONCAT71(local_c0._1_7_,cVar14);
              local_48.X = 0.0;
              local_48.Y = 0.0;
              AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_48);
              (thing->__Pos).Z = local_108.dx;
              (thing->__Pos).Y = local_108.y;
              (thing->__Pos).X = local_108.x;
              P_TranslatePortalVXVY(local_110,&local_70->X,local_78);
              P_TranslatePortalAngle(local_110,local_80);
              AActor::LinkToWorld(thing,(FLinkContext *)&local_48,false,(sector_t *)0x0);
              P_FindFloorCeiling(thing,0);
              dVar32 = (thing->__Pos).X;
              dVar33 = (thing->__Pos).Y;
              (thing->Prev).Z = (thing->__Pos).Z;
              (thing->Prev).X = dVar32;
              (thing->Prev).Y = dVar33;
              (thing->PrevAngles).Roll.Degrees = (thing->Angles).Roll.Degrees;
              dVar32 = (thing->Angles).Yaw.Degrees;
              (thing->PrevAngles).Pitch.Degrees = (thing->Angles).Pitch.Degrees;
              (thing->PrevAngles).Yaw.Degrees = dVar32;
              if (thing->Sector == (sector_t *)0x0) {
                thing->PrevPortalGroup = 0;
              }
              else {
                thing->PrevPortalGroup = thing->Sector->PortalGroup;
              }
              tm->portalstep = false;
              local_d0 = CONCAT71((int7)((ulong)tm >> 8),1);
              cVar14 = local_c0._0_1_;
            }
            else {
              (thing->__Pos).Z = dVar32;
              (thing->__Pos).Y = local_68;
              (thing->__Pos).X = local_c0;
              pbVar2 = (byte *)((long)&(thing->flags6).Value + 3);
              *pbVar2 = *pbVar2 & 0xef;
            }
            cVar20 = '\x01';
            if (cVar14 == '\0') goto LAB_0040d856;
          }
          pAVar18 = (AActor *)(&DAT_017e5fc8)[(long)consoleplayer * 0x54];
          if ((pAVar18 != (AActor *)0x0) &&
             (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
            pAVar18 = (AActor *)0x0;
          }
          if (pAVar18 == thing) {
            local_108.x = (local_58 - local_e0) * dVar30 + local_e0;
            local_108.y = (local_60 - local_c8) * dVar30 + local_c8;
            local_108.dx = 0.0;
            local_108.dy = 0.0;
            R_AddInterpolationPoint((DVector3a *)&local_108);
            if (pFVar27->mType == '\x03') {
              local_108.x = (pFVar27->mDisplacement).X + local_108.x;
              local_108.y = (pFVar27->mDisplacement).Y + local_108.y;
            }
            else {
              P_TranslatePortalXY(local_110,&local_108.x,&local_108.y);
              P_TranslatePortalZ(local_110,&local_108.dx);
              *(double *)(&DAT_017e5eb0 + (long)consoleplayer * 0x2a0) =
                   local_108.dx + *(double *)(&DAT_017e5eb0 + (long)consoleplayer * 0x2a0);
              P_TranslatePortalAngle(local_110,(DAngle *)&local_108.dy);
            }
            R_AddInterpolationPoint((DVector3a *)&local_108);
          }
          cVar20 = (pFVar27->mType != '\x03') + '\x03';
        }
LAB_0040d856:
      } while (cVar20 == '\x03');
      if (cVar20 != '\x04') {
        return false;
      }
      if ((local_d0 & 1) == 0) {
        local_108.x = 0.0;
        local_108.y = 0.0;
        AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_108);
        thing->floorz = tm->floorz;
        thing->ceilingz = tm->ceilingz;
        thing->dropoffz = tm->dropoffz;
        (thing->floorpic).texnum = (tm->floorpic).texnum;
        thing->floorterrain = tm->floorterrain;
        thing->floorsector = tm->floorsector;
        (thing->ceilingpic).texnum = (tm->ceilingpic).texnum;
        thing->ceilingsector = tm->ceilingsector;
        (thing->__Pos).X = local_d8->X;
        (thing->__Pos).Y = local_d8->Y;
        AActor::LinkToWorld(thing,(FLinkContext *)&local_108,false,(sector_t *)0x0);
      }
      if (((thing->flags2).Value & 0x20) != 0) {
        AActor::AdjustFloorClip(thing);
      }
      if (((thing->flags).Value & 0x9000) == 0) {
LAB_0040da0b:
        if (spechit.Count != 0) {
          spechit.Count = spechit.Count - 1;
          line = (line_t_conflict *)spechit.Array[spechit.Count].line;
          dVar30 = spechit.Array[spechit.Count].Oldrefpos.Y;
          dVar32 = spechit.Array[spechit.Count].Oldrefpos.X;
          local_c8 = spechit.Array[spechit.Count].Refpos.Y;
          local_e0 = spechit.Array[spechit.Count].Refpos.X;
          if (((byte)i_compatflags2 & 8) == 0) {
            uVar15 = (uint)(1.52587890625e-05 <
                           ((line->v1->p).X - local_e0) * (line->delta).Y +
                           (local_c8 - (line->v1->p).Y) * (line->delta).X);
          }
          else {
            uVar15 = P_VanillaPointOnLineSide(local_e0,local_c8,(line_t *)line);
          }
          if (((byte)i_compatflags2 & 8) == 0) {
            uVar16 = (uint)(1.52587890625e-05 <
                           ((line->v1->p).X - dVar32) * (line->delta).Y +
                           (dVar30 - (line->v1->p).Y) * (line->delta).X);
          }
          else {
            uVar16 = P_VanillaPointOnLineSide(dVar32,dVar30,(line_t *)line);
          }
          if (((uVar15 != uVar16) && (iVar21 = line->special, iVar21 != 0)) &&
             (((thing->flags6).Value & 0x10000) == 0)) {
            ppVar6 = thing->player;
            if (ppVar6 == (player_t *)0x0) {
LAB_0040db6f:
              uVar15 = (thing->flags2).Value;
              if ((uVar15 >> 0x17 & 1) == 0) {
                if ((uVar15 >> 0x18 & 1) == 0) {
                  if ((iVar21 - 0x46U < 2) || (iVar21 == 0xd7)) goto LAB_0040db91;
                  iVar21 = 0x80;
                }
                else {
                  iVar21 = 0x20;
                }
              }
              else {
LAB_0040db91:
                iVar21 = 4;
              }
            }
            else {
              if ((ppVar6->cheats & 0x2000) != 0) {
                P_PredictLine(line,thing,uVar16,1);
                goto LAB_0040da0b;
              }
              if (ppVar6 == (player_t *)0x0) goto LAB_0040db6f;
              iVar21 = 1;
            }
            P_ActivateLine(line,thing,uVar16,iVar21,(DVector3 *)0x0);
          }
          goto LAB_0040da0b;
        }
      }
      if ((thing->player != (player_t *)0x0) &&
         (bVar13 = true, (thing->player->cheats & 0x2000) != 0)) goto LAB_0040dde8;
      psVar7 = thing->Sector;
      if ((psVar7->heightsec != (sector_t *)0x0) &&
         ((local_b8->heightsec != (sector_t *)0x0 &&
          (pAVar23 = (psVar7->SecActTarget).field_0.p, pAVar23 != (ASectorAction *)0x0)))) {
        if (((pAVar23->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
          psVar8 = psVar7->heightsec;
          dVar31 = dVar31 + (thing->__Pos).Z;
          dVar30 = ((psVar8->floorplane).normal.Y * local_d8->Y +
                   (psVar8->floorplane).normal.X * local_d8->X + (psVar8->floorplane).D) *
                   (psVar8->floorplane).negiC;
          if ((bool)(dVar30 < dVar31 & bVar12)) {
            pAVar23 = (psVar7->SecActTarget).field_0.p;
            iVar21 = 0x80;
LAB_0040dc16:
            ASectorAction::TriggerAction(pAVar23,thing,iVar21);
          }
          else if (!bVar12 && dVar31 <= dVar30) {
            pAVar23 = (psVar7->SecActTarget).field_0.p;
            iVar21 = 0x40;
            goto LAB_0040dc16;
          }
          if ((psVar8->MoreFlags & 2) == 0) {
            dVar30 = ((psVar8->ceilingplane).normal.Y * local_d8->Y +
                     (psVar8->ceilingplane).normal.X * local_d8->X + (psVar8->ceilingplane).D) *
                     (psVar8->ceilingplane).negiC;
            if ((bool)(dVar30 < dVar31 & bVar10)) {
              pAVar23 = (psVar7->SecActTarget).field_0.p;
              iVar21 = 0x200;
            }
            else {
              if (bVar10 || dVar30 < dVar31) goto LAB_0040dcb0;
              pAVar23 = (psVar7->SecActTarget).field_0.p;
              iVar21 = 0x100;
            }
            ASectorAction::TriggerAction(pAVar23,thing,iVar21);
          }
        }
        else {
          (psVar7->SecActTarget).field_0.p = (ASectorAction *)0x0;
        }
      }
LAB_0040dcb0:
      if (tm->portalstep == true) {
        local_108.x = 0.0;
        local_108.y = 0.0;
        local_e0 = (thing->__Pos).X;
        dVar30 = (thing->__Pos).Y;
        dVar31 = (thing->__Pos).Z;
        AActor::UnlinkFromWorld(thing,(FLinkContext *)&local_108);
        iVar21 = thing->Sector->PortalGroup;
        iVar4 = (sectorPortals.Array[thing->Sector->Portals[1]].mDestination)->PortalGroup;
        dVar32 = 0.0;
        dVar33 = 0.0;
        if (iVar21 != iVar4) {
          iVar21 = iVar4 * Displacements.size + iVar21;
          dVar32 = Displacements.data.Array[iVar21].pos.X;
          dVar33 = Displacements.data.Array[iVar21].pos.Y;
        }
        dVar33 = (thing->__Pos).Y + dVar33;
        dVar32 = (thing->__Pos).X + dVar32;
        (thing->__Pos).Y = dVar33;
        (thing->__Pos).X = dVar32;
        (thing->Prev).Z = (thing->__Pos).Z - dVar31;
        (thing->Prev).Y = dVar33 - dVar30;
        (thing->Prev).X = dVar32 - local_e0;
        psVar19 = P_PointInSubsector(dVar32,dVar33);
        psVar9 = psVar19->sector;
        thing->Sector = (sector_t *)psVar9;
        thing->PrevPortalGroup = psVar9->PortalGroup;
        AActor::LinkToWorld(thing,(FLinkContext *)&local_108,false,(sector_t *)0x0);
        P_FindFloorCeiling(thing,0);
      }
      AActor::CheckSectorTransition(thing,local_b8);
      bVar13 = true;
      goto LAB_0040dde8;
    }
LAB_0040cfd6:
    (thing->__Pos).Z = dVar30;
  }
LAB_0040d0e6:
  bVar13 = false;
LAB_0040dde8:
  pbVar2 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar2 = *pbVar2 & 0xef;
  return bVar13;
}

Assistant:

bool P_TryMove(AActor *thing, const DVector2 &pos,
	int dropoff, // killough 3/15/98: allow dropoff as option
	const secplane_t *onfloor, // [RH] Let P_TryMove keep the thing on the floor
	FCheckPosition &tm,
	bool missileCheck)	// [GZ] Fired missiles ignore the drop-off test
{
	sector_t	*oldsector;
	double		oldz;
	int 		side;
	int 		oldside;
	sector_t*	oldsec = thing->Sector;	// [RH] for sector actions
	sector_t*	newsec;

	tm.floatok = false;
	tm.portalstep = false;
	oldz = thing->Z();
	if (onfloor)
	{
		thing->SetZ(onfloor->ZatPoint(pos));
	}
	thing->flags6 |= MF6_INTRYMOVE;
	if (!P_CheckPosition(thing, pos, tm))
	{
		AActor *BlockingMobj = thing->BlockingMobj;
		// Solid wall or thing
		if (!BlockingMobj || BlockingMobj->player || !thing->player)
		{
			goto pushline;
		}
		else
		{
			if (BlockingMobj->player || !thing->player)
			{
				goto pushline;
			}
			else if (BlockingMobj->Top() - thing->Z() > thing->MaxStepHeight
				|| ((BlockingMobj->Sector->ceilingplane.ZatPoint(pos) - (BlockingMobj->Top()) < thing->Height) && BlockingMobj->Sector->PortalBlocksMovement(sector_t::ceiling))
				|| (tm.ceilingz - (BlockingMobj->Top()) < thing->Height))
			{
				goto pushline;
			}
		}
		if (!(tm.thing->flags2 & MF2_PASSMOBJ) || (i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		thing->SetZ(tm.floorz);
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		thing->SetZ(tm.ceilingz - thing->Height);
	}

	if (onfloor && tm.floorsector == thing->floorsector)
	{
		thing->SetZ(tm.floorz);
	}
	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			goto pushline;		// doesn't fit
		}

		tm.floatok = true;

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz < thing->Top()
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			goto pushline;		// mobj must lower itself to fit
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
#if 1
			if (thing->Top() > tm.ceilingz)
				goto pushline;
#else
			// When flying, slide up or down blocking lines until the actor
			// is not blocked.
			if (thing->Top() > tm.ceilingz)
			{
				thing->Vel.Z = -8;
				goto pushline;
			}
			else if (thing->Z() < tm.floorz && tm.floorz - tm.dropoffz > thing->MaxDropOffHeight)
			{
				thing->Vel.Z = 8;
				goto pushline;
			}
#endif
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > thing->Z())
			{ // [RH] Don't let normal missiles climb steps
				goto pushline;
			}
			if (tm.floorz - thing->Z() > thing->MaxStepHeight)
			{ // too big a step up
				goto pushline;
			}
			else if (thing->Z() < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				bool good;
				thing->SetZ(tm.floorz);
				good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					goto pushline;
				}
				if (thing->flags6 & MF6_STEPMISSILE)
				{
					thing->SetZ(tm.floorz);
					// If moving down, cancel vertical component of the velocity
					if (thing->Vel.Z < 0)
					{
						// If it's a bouncer, let it bounce off its new floor, too.
						if (thing->BounceFlags & BOUNCE_Floors)
						{
							thing->FloorBounceMissile(tm.floorsector->floorplane);
						}
						else
						{
							thing->Vel.Z = 0;
						}
					}
				}
			}
		}

		// compatibility check: Doom originally did not allow monsters to cross dropoffs at all.
		// If the compatibility flag is on, only allow this when the velocity comes from a scroller
		if ((i_compatflags & COMPATF_CROSSDROPOFF) && !(thing->flags4 & MF4_SCROLLMOVE))
		{
			dropoff = false;
		}

		if (dropoff == 2 &&  // large jump down (e.g. dogs)
			(tm.floorz - tm.dropoffz > 128. || thing->target == NULL || thing->target->Z() >tm.dropoffz))
		{
			dropoff = false;
		}


		// killough 3/15/98: Allow certain objects to drop off
		if ((!dropoff && !(thing->flags & (MF_DROPOFF | MF_FLOAT | MF_MISSILE))) || (thing->flags5&MF5_NODROPOFF))
		{
			if (!(thing->flags5&MF5_AVOIDINGDROPOFF))
			{
				double floorz = tm.floorz;
				// [RH] If the thing is standing on something, use its current z as the floorz.
				// This is so that it does not walk off of things onto a drop off.
				if (thing->flags2 & MF2_ONMOBJ)
				{
					floorz = MAX(thing->Z(), tm.floorz);
				}

				if (floorz - tm.dropoffz > thing->MaxDropOffHeight &&
					!(thing->flags2 & MF2_BLASTED) && !missileCheck)
				{ // Can't move over a dropoff unless it's been blasted
					// [GZ] Or missile-spawned
					thing->SetZ(oldz);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
			else
			{
				// special logic to move a monster off a dropoff
				// this intentionally does not check for standing on things.
				if (thing->floorz - tm.floorz > thing->MaxDropOffHeight ||
					thing->dropoffz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
		}
		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - thing->Z() != 0))
		{ // must stay within a sector of a certain floor type
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}

		//Added by MC: To prevent bot from getting into dangerous sectors.
		if (thing->player && thing->player->Bot != NULL && thing->flags & MF_SHOOTABLE)
		{
			if (tm.sector != thing->Sector
				&& bglobal.IsDangerous(tm.sector))
			{
				thing->player->Bot->prev = thing->player->Bot->dest;
				thing->player->Bot->dest = NULL;
				thing->Vel.X = thing->Vel.Y = 0;
				thing->SetZ(oldz);
				thing->flags6 &= ~MF6_INTRYMOVE;
				return false;
			}
		}
	}

	// [RH] Check status of eyes against fake floor/ceiling in case
	// it slopes or the player's eyes are bobbing in and out.

	bool oldAboveFakeFloor, oldAboveFakeCeiling;
	double viewheight;
	// pacify GCC
	viewheight = thing->player ? thing->player->viewheight : thing->Height / 2;
	oldAboveFakeFloor = oldAboveFakeCeiling = false;

	if (oldsec->heightsec)
	{
		double eyez = oldz + viewheight;

		oldAboveFakeFloor = eyez > oldsec->heightsec->floorplane.ZatPoint(thing);
		oldAboveFakeCeiling = eyez > oldsec->heightsec->ceilingplane.ZatPoint(thing);
	}

	// Borrowed from MBF: 
	if (thing->BounceFlags & BOUNCE_MBF &&  // killough 8/13/98
		!(thing->flags & (MF_MISSILE | MF_NOGRAVITY)) &&
		!thing->IsSentient() && tm.floorz - thing->Z() > 16)
	{ // too big a step up for MBF bouncers under gravity
		thing->flags6 &= ~MF6_INTRYMOVE;
		return false;
	}


	// Check for crossed portals
	bool portalcrossed;
	portalcrossed = false;

	while (true)
	{
		double bestfrac = 1.1;
		spechit_t besthit;
		int besthitnum;
		// find the portal nearest to the crossing actor
		for (unsigned i = 0; i < portalhit.Size();i++)
		{
			auto &spec = portalhit[i];

			line_t *ld = spec.line;
			if (ld->frontsector->PortalGroup != thing->Sector->PortalGroup) continue;	// must be in the same group to be considered valid.

			// see if the line was crossed
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			side = P_PointOnLineSide(spec.Refpos, ld);
			if (oldside == 0 && side == 1)
			{
				divline_t dl2 = { ld->v1->fX(), ld->v1->fY(), ld->Delta().X, ld->Delta().Y };
				divline_t dl1 = { spec.Oldrefpos.X, spec.Oldrefpos.Y, spec.Refpos.X - spec.Oldrefpos.X, spec.Refpos.Y - spec.Oldrefpos.Y };
				double frac = P_InterceptVector(&dl1, &dl2);
				if (frac < bestfrac)
				{
					besthit = spec;
					bestfrac = frac;
					besthitnum = i;
				}
			}
		}

		if (bestfrac < 1.1)
		{
			portalhit.Delete(besthitnum);
			line_t *ld = besthit.line;
			FLinePortal *port = ld->getPortal();
			if (port->mType == PORTT_LINKED)
			{
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXY(tm.pos + port->mDisplacement);
				thing->Prev += port->mDisplacement;
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				portalcrossed = true;
				tm.portalstep = false;
			}
			else if (!portalcrossed)
			{
				DVector3 pos(tm.pos, thing->Z());
				DVector3 oldthingpos = thing->Pos();
				DVector2 thingpos = oldthingpos;
				
				P_TranslatePortalXY(ld, pos.X, pos.Y);
				P_TranslatePortalXY(ld, thingpos.X, thingpos.Y);
				P_TranslatePortalZ(ld, pos.Z);
				thing->SetXYZ(thingpos.X, thingpos.Y, pos.Z);
				if (!P_CheckPosition(thing, pos, true))	// check if some actor blocks us on the other side. (No line checks, because of the mess that'd create.)
				{
					thing->SetXYZ(oldthingpos);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXYZ(pos);
				P_TranslatePortalVXVY(ld, thing->Vel.X, thing->Vel.Y);
				P_TranslatePortalAngle(ld, thing->Angles.Yaw);
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				thing->ClearInterpolation();
				portalcrossed = true;
				tm.portalstep = false;
			}
			// if this is the current camera we need to store the point where the portal was crossed and the exit
			// so that the renderer can properly calculate an interpolated position along the movement path.
			if (thing == players[consoleplayer].camera)
			{
				divline_t dl1 = { besthit.Oldrefpos.X,besthit.Oldrefpos.Y, besthit.Refpos.X - besthit.Oldrefpos.X, besthit.Refpos.Y - besthit.Oldrefpos.Y };
				DVector3a hit = { {dl1.x + dl1.dx * bestfrac, dl1.y + dl1.dy * bestfrac, 0.},0. };

				R_AddInterpolationPoint(hit);
				if (port->mType == PORTT_LINKED)
				{
					hit.pos.X += port->mDisplacement.X;
					hit.pos.Y += port->mDisplacement.Y;
				}
				else
				{
					P_TranslatePortalXY(ld, hit.pos.X, hit.pos.Y);
					P_TranslatePortalZ(ld, hit.pos.Z);
					players[consoleplayer].viewz += hit.pos.Z;	// needs to be done here because otherwise the renderer will not catch the change.
					P_TranslatePortalAngle(ld, hit.angle);
				}
				R_AddInterpolationPoint(hit);
			}
			if (port->mType == PORTT_LINKED)
			{
				continue;
		}
		}
		break;
	}



	if (!portalcrossed)
	{
		// the move is ok, so link the thing into its new position
		FLinkContext ctx;
		thing->UnlinkFromWorld(&ctx);

		oldsector = thing->Sector;
		thing->floorz = tm.floorz;
		thing->ceilingz= tm.ceilingz;
		thing->dropoffz = tm.dropoffz;		// killough 11/98: keep track of dropoffs
		thing->floorpic = tm.floorpic;
		thing->floorterrain = tm.floorterrain;
		thing->floorsector = tm.floorsector;
		thing->ceilingpic = tm.ceilingpic;
		thing->ceilingsector = tm.ceilingsector;
		thing->SetXY(pos);

		thing->LinkToWorld(&ctx);
	}

	if (thing->flags2 & MF2_FLOORCLIP)
	{
		thing->AdjustFloorClip();
	}

	// if any special lines were hit, do the effect
	if (!(thing->flags & (MF_TELEPORT | MF_NOCLIP)))
	{
		spechit_t spec;
		DVector2 lastpos = thing->Pos();
		while (spechit.Pop(spec))
		{
			line_t *ld = spec.line;
			// see if the line was crossed

			side = P_PointOnLineSide(spec.Refpos, ld);
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			if (side != oldside && ld->special && !(thing->flags6 & MF6_NOTRIGGER))
			{
				if (thing->player && (thing->player->cheats & CF_PREDICTING))
				{
					P_PredictLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->player)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->flags2 & MF2_MCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else if (thing->flags2 & MF2_PCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_PCross);
				}
				else if ((ld->special == Teleport ||
					ld->special == Teleport_NoFog ||
					ld->special == Teleport_Line))
				{	// [RH] Just a little hack for BOOM compatibility
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else
				{
					P_ActivateLine(ld, thing, oldside, SPAC_AnyCross);
				}
			}
		}
	}

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		thing->flags6 &= ~MF6_INTRYMOVE;
		return true;
	}

	// [RH] Check for crossing fake floor/ceiling
	newsec = thing->Sector;
	if (newsec->heightsec && oldsec->heightsec && newsec->SecActTarget)
	{
		const sector_t *hs = newsec->heightsec;
		double eyez = thing->Z() + viewheight;
		double fakez = hs->floorplane.ZatPoint(pos);

		if (!oldAboveFakeFloor && eyez > fakez)
		{ // View went above fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesSurface);
		}
		else if (oldAboveFakeFloor && eyez <= fakez)
		{ // View went below fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			fakez = hs->ceilingplane.ZatPoint(pos);
			if (!oldAboveFakeCeiling && eyez > fakez)
			{ // View went above fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesAboveC);
			}
			else if (oldAboveFakeCeiling && eyez <= fakez)
			{ // View went below fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesBelowC);
			}
		}
	}

	// If the actor stepped through a ceiling portal we need to reacquire the actual position info after the transition
	if (tm.portalstep)
	{
		FLinkContext ctx;
		DVector3 oldpos = thing->Pos();
		thing->UnlinkFromWorld(&ctx);
		thing->SetXYZ(thing->PosRelative(thing->Sector->GetOppositePortalGroup(sector_t::ceiling)));
		thing->Prev = thing->Pos() - oldpos;
		thing->Sector = P_PointInSector(thing->Pos());
		thing->PrevPortalGroup = thing->Sector->PortalGroup;
		thing->LinkToWorld(&ctx);

		P_FindFloorCeiling(thing);
	}

	// [RH] If changing sectors, trigger transitions
	thing->CheckSectorTransition(oldsec);
	thing->flags6 &= ~MF6_INTRYMOVE;
	return true;

pushline:
	thing->flags6 &= ~MF6_INTRYMOVE;

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		return false;
	}

	thing->SetZ(oldz);
	if (!(thing->flags&(MF_TELEPORT | MF_NOCLIP)))
	{
		int numSpecHitTemp;

		if (tm.thing->flags2 & MF2_BLASTED)
		{
			P_DamageMobj(tm.thing, NULL, NULL, tm.thing->Mass >> 5, NAME_Melee);
		}
		numSpecHitTemp = (int)spechit.Size();
		while (numSpecHitTemp > 0)
		{
			// see which lines were pushed
			spechit_t &spec = spechit[--numSpecHitTemp];
			side = P_PointOnLineSide(spec.Refpos, spec.line);
			CheckForPushSpecial(spec.line, side, thing, &spec.Refpos);
		}
	}
	return false;
}